

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_closed_list.hpp
# Opt level: O3

void __thiscall
compress::CompressClosedList<Node<Tiles>_>::CompressClosedList
          (CompressClosedList<Node<Tiles>_> *this,bool reopen_closed,bool enable_partitioning,
          bool double_hashing,size_t internal_closed_bytes)

{
  _IO_FILE *p_Var1;
  int iVar2;
  pointer __p;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  IOException *pIVar6;
  size_type __new_size;
  string local_60;
  TabulationHash<Node<Tiles>_> *local_40;
  TabulationHash<Node<Tiles>_> *local_38;
  
  this->reopen_closed = reopen_closed;
  this->enable_partitioning = enable_partitioning;
  this->double_hashing = double_hashing;
  local_38 = &this->hasher;
  TabulationHash<Node<Tiles>_>::TabulationHash(local_38);
  local_40 = &this->partition_hasher;
  TabulationHash<Node<Tiles>_>::TabulationHash(local_40);
  (this->buffers).
  super__Vector_base<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition_table)._M_t.
  super___uniq_ptr_impl<MappingTable,_std::default_delete<MappingTable>_>._M_t.
  super__Tuple_impl<0UL,_MappingTable_*,_std::default_delete<MappingTable>_>.
  super__Head_base<0UL,_MappingTable_*,_false>._M_head_impl = (MappingTable *)0x0;
  (this->buffers).
  super__Vector_base<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_partitions = 100;
  PointerTable::PointerTable(&this->internal_closed,internal_closed_bytes);
  this->external_closed_index = 0;
  this->external_closed_bytes = 0;
  this->max_buffer_size_in_bytes = 0x4000;
  this->buffer_hits = 0;
  this->good_probes = 0;
  this->bad_probes = 0;
  this->max_buffer_entries = 0x35e;
  __new_size = 1;
  if (enable_partitioning) {
    __p = (pointer)operator_new(0x20);
    (__p->table).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->table).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->table).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __p->nodes_per_map = 0x35e;
    std::__uniq_ptr_impl<MappingTable,_std::default_delete<MappingTable>_>::reset
              ((__uniq_ptr_impl<MappingTable,_std::default_delete<MappingTable>_> *)
               &this->partition_table,__p);
    __new_size = (size_type)this->n_partitions;
  }
  std::
  vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
  ::resize(&this->buffers,__new_size);
  lVar3 = PointerTable::get_max_entries();
  this->external_closed_bytes = lVar3 * 0x13;
  dfpair(_stdout,"external closed (bytes)","%lu");
  iVar2 = open("closed_list.bucket",0x242,0x180);
  this->external_closed_fd = iVar2;
  if (iVar2 < 0) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Fail to create closed list file","");
    IOException::IOException(pIVar6,&local_60);
    __cxa_throw(pIVar6,&IOException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = posix_fallocate64(iVar2,0,this->external_closed_bytes);
  if (iVar2 < 0) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Fail to fallocate closed list file","");
    IOException::IOException(pIVar6,&local_60);
    __cxa_throw(pIVar6,&IOException::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = (char *)mmap((void *)0x0,this->external_closed_bytes,3,1,this->external_closed_fd,0);
  this->external_closed = pcVar4;
  if (pcVar4 != (char *)0xffffffffffffffff) {
    iVar2 = madvise(pcVar4,this->external_closed_bytes,1);
    if (-1 < iVar2) {
      if (enable_partitioning) {
        dfpair(_stdout,"number of partitions","%u",(ulong)this->n_partitions);
      }
      pcVar4 = "linear probing";
      if (double_hashing) {
        pcVar4 = "double hashing";
      }
      dfpair(_stdout,"probe strategy","%s",pcVar4);
      p_Var1 = _stdout;
      uVar5 = PointerTable::get_max_entries();
      dfpair(p_Var1,"max capacity of closed list (nodes)","%lu",uVar5);
      return;
    }
    pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Fail to give madvise for closed list file","");
    IOException::IOException(pIVar6,&local_60);
    __cxa_throw(pIVar6,&IOException::typeinfo,std::runtime_error::~runtime_error);
  }
  pIVar6 = (IOException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Fail to mmap closed list file","");
  IOException::IOException(pIVar6,&local_60);
  __cxa_throw(pIVar6,&IOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CompressClosedList<Entry>::CompressClosedList(bool reopen_closed,
                                                  bool enable_partitioning,
                                                  bool double_hashing,
                                                  size_t internal_closed_bytes)
        : reopen_closed(reopen_closed),
          enable_partitioning(enable_partitioning),
          double_hashing(double_hashing),
          internal_closed(internal_closed_bytes) 
    {
        max_buffer_entries = max_buffer_size_in_bytes / Entry::get_size_in_bytes();
        
        // initialize partition table
        if (enable_partitioning) {
            partition_table =
                memory::make_unique<MappingTable>(max_buffer_entries);
           
            buffers.resize(n_partitions);
        } else {
            buffers.resize(1); // use only buffers[0] if no partitioning
        }
        
        // initialize external closed list
        external_closed_bytes =
            internal_closed.get_max_entries() * Entry::get_size_in_bytes();
        dfpair(stdout, "external closed (bytes)", "%lu", external_closed_bytes);

        external_closed_fd = open("closed_list.bucket", O_CREAT | O_TRUNC | O_RDWR,
                                  S_IRUSR | S_IWUSR);
        if (external_closed_fd < 0)
            throw IOException("Fail to create closed list file");
        
        if (posix_fallocate64(external_closed_fd, 0, external_closed_bytes) < 0)
            throw IOException("Fail to fallocate closed list file");
        
        external_closed =
            static_cast<char *>(mmap(NULL, external_closed_bytes,
                                     PROT_READ | PROT_WRITE, MAP_SHARED,
                                     external_closed_fd, 0));
        if (external_closed == MAP_FAILED)
            throw IOException("Fail to mmap closed list file");

        if (madvise(external_closed, external_closed_bytes, MADV_RANDOM) < 0)
            throw IOException("Fail to give madvise for closed list file");

        // Logging
        if (enable_partitioning)
            dfpair(stdout, "number of partitions", "%u", n_partitions);
        if (double_hashing) {
            dfpair(stdout, "probe strategy", "%s", "double hashing");
        } else {
            dfpair(stdout, "probe strategy", "%s", "linear probing");
        }
        dfpair(stdout, "max capacity of closed list (nodes)", "%lu",
               internal_closed.get_max_entries());
    }